

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionEntryPointInfo::Expire(FunctionEntryPointInfo *this)

{
  undefined1 *puVar1;
  uint sourceContextId;
  uint uVar2;
  FunctionProxy *pFVar3;
  ThreadContext *this_00;
  Type pSVar4;
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar5;
  ScriptFunctionType *pSVar6;
  PVOID dynamicInterpreterThunk;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar7;
  bool bVar8;
  ExecutionMode EVar9;
  LocalFunctionId functionId;
  undefined4 *puVar10;
  FunctionBody *pFVar11;
  FunctionEntryPointInfo *pFVar12;
  FunctionEntryPointInfo *pFVar13;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar14;
  code *pcVar15;
  JavascriptMethod p_Var16;
  JavascriptMethod p_Var17;
  ulong uVar18;
  ulong uVar19;
  int i;
  long lVar20;
  anon_class_16_2_2511f9eb local_60;
  FunctionEntryPointInfo *local_50;
  FunctionBody *local_48;
  AutoNestedHandledExceptionType local_3c;
  FunctionEntryPointInfo *pFStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  FunctionEntryPointInfo *newEntryPoint;
  
  if (((this->lastCallsCount == this->callsCount) &&
      (((this->super_EntryPointInfo).field_0x18 & 0x10) != 0)) &&
     (bVar8 = EntryPointInfo::IsCleanedUp(&this->super_EntryPointInfo), !bVar8)) {
    pFVar3 = (this->functionProxy).ptr;
    this_00 = pFVar3->m_scriptContext->threadContext;
    bVar8 = FunctionProxy::IsDeferred(pFVar3);
    if (bVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x2475,"(!this->functionProxy->IsDeferred())",
                                  "!this->functionProxy->IsDeferred()");
      if (!bVar8) {
        pcVar15 = (code *)invalidInstructionException();
        (*pcVar15)();
      }
      *puVar10 = 0;
    }
    pFVar11 = FunctionProxy::GetFunctionBody((this->functionProxy).ptr);
    pFVar12 = FunctionProxy::
              GetAuxPtr<(Js::FunctionProxy::AuxPointerType)6,Js::FunctionEntryPointInfo*>
                        ((FunctionProxy *)pFVar11);
    local_50 = pFVar12;
    if (pFVar12 == this) {
      EVar9 = FunctionExecutionStateMachine::GetExecutionMode(&pFVar11->executionState);
      if (EVar9 != FullJit) {
        return;
      }
      pFVar12 = (FunctionEntryPointInfo *)0x0;
      FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)6,Js::FunctionEntryPointInfo*>
                ((FunctionProxy *)pFVar11,(FunctionEntryPointInfo *)0x0);
    }
    local_48 = pFVar11;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_3c,ExceptionType_OutOfMemory);
    pFStack_38 = (FunctionEntryPointInfo *)0x0;
    pFVar13 = FunctionBody::GetDefaultFunctionEntryPointInfo(pFVar11);
    if (pFVar13 == this) {
      if (pFVar12 == (FunctionEntryPointInfo *)0x0) {
        if (((pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
          pFStack_38 = FunctionBody::CreateNewDefaultEntryPoint(pFVar11);
          FunctionBody::ReinitializeExecutionModeAndLimits(pFVar11);
          sourceContextId =
               ((((((pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)
                  ->m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
          functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
          bVar8 = Phases::IsEnabled((Phases *)&DAT_01441eb0,BackEndPhase,sourceContextId,functionId)
          ;
          if ((!bVar8) &&
             (pSVar4 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
             (pSVar4->config).NoNative == false)) {
            GenerateFunction(pSVar4->nativeCodeGen,pFVar11,(ScriptFunction *)0x0);
          }
        }
        else {
          pFStack_38 = FunctionBody::CreateNewDefaultEntryPoint(pFVar11);
          puVar1 = &(pFStack_38->super_EntryPointInfo).field_0x18;
          *puVar1 = *puVar1 | 8;
          (pFStack_38->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod =
               InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
          pFVar11->field_0x17b = pFVar11->field_0x17b & 0x7f;
          FunctionExecutionStateMachine::SetDefaultInterpreterExecutionMode
                    (&pFVar11->executionState);
          FunctionProxy::SetOriginalEntryPoint
                    ((this->functionProxy).ptr,
                     InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk);
        }
      }
      else {
        pFStack_38 = pFVar12;
        p_Var17 = EntryPointInfo::GetNativeEntrypoint(&pFVar12->super_EntryPointInfo);
        FunctionBody::SetDefaultFunctionEntryPointInfo(pFVar11,pFVar12,p_Var17);
        FunctionBody::ResetSimpleJitLimitAndCallCount(pFVar11);
      }
      FunctionBody::TraceExecutionMode(pFVar11,"JitCodeExpired");
      pFVar13 = pFStack_38;
    }
    pFStack_38 = pFVar13;
    Output::Trace(ExpirableCollectPhase,L"Expiring 0x%p\n",this);
    pFVar3 = (this->functionProxy).ptr;
    local_60.newEntryPoint = &stack0xffffffffffffffc8;
    local_60.this = this;
    pLVar14 = FunctionProxy::
              GetAuxPtr<(Js::FunctionProxy::AuxPointerType)7,JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>*>
                        (pFVar3);
    if (pLVar14 !=
        (List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
         *)0x0) {
      for (lVar20 = 0;
          lVar20 < (pLVar14->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                   ).count; lVar20 = lVar20 + 1) {
        pRVar5 = (pLVar14->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar20].ptr;
        if ((((ulong)pRVar5 & 1) == 0 &&
             pRVar5 != (RecyclerWeakReference<Js::ScriptFunctionType> *)0x0) &&
           (pSVar6 = (ScriptFunctionType *)(pRVar5->super_RecyclerWeakReferenceBase).strongRef,
           pSVar6 != (ScriptFunctionType *)0x0)) {
          Expire::anon_class_16_2_2511f9eb::operator()(&local_60,pSVar6);
        }
      }
    }
    pFVar11 = local_48;
    pSVar6 = (pFVar3->deferredPrototypeType).ptr;
    if (pSVar6 != (ScriptFunctionType *)0x0) {
      Expire::anon_class_16_2_2511f9eb::operator()(&local_60,pSVar6);
    }
    pSVar6 = (pFVar3->undeferredFunctionType).ptr;
    if (pSVar6 != (ScriptFunctionType *)0x0) {
      Expire::anon_class_16_2_2511f9eb::operator()(&local_60,pSVar6);
    }
    if (local_50 == this) {
      dynamicInterpreterThunk = (pFVar11->super_ParseableFunctionInfo).m_dynamicInterpreterThunk;
      if (dynamicInterpreterThunk == (PVOID)0x0) {
        pcVar15 = InterpreterStackFrame::DelayDynamicInterpreterThunk;
      }
      else {
        pcVar15 = (code *)InterpreterThunkEmitter::ConvertToEntryPoint(dynamicInterpreterThunk);
      }
      p_Var17 = ((pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                CurrentThunk;
      if (p_Var17 == InterpreterStackFrame::DelayDynamicInterpreterThunk) {
        p_Var17 = pcVar15;
      }
      p_Var16 = EntryPointInfo::GetNativeEntrypoint(&this->super_EntryPointInfo);
      pSVar7 = (pFVar11->entryPoints).ptr;
      if (pSVar7 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                     *)0x0) {
        uVar2 = (pSVar7->
                super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                .count;
        uVar19 = 0;
        uVar18 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar18 = uVar19;
        }
        for (; uVar18 != uVar19; uVar19 = uVar19 + 1) {
          pFVar12 = (FunctionEntryPointInfo *)
                    (((pSVar7->
                      super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ).
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                      .buffer.ptr[uVar19].ptr)->super_RecyclerWeakReferenceBase).strongRef;
          if ((pFVar12 != this && pFVar12 != (FunctionEntryPointInfo *)0x0) &&
             ((pFVar12->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod == (Type)p_Var16))
          {
            (pFVar12->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod = (Type)p_Var17;
          }
        }
      }
      p_Var17 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)pFVar11);
      if (p_Var17 == p_Var16) {
        FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)pFVar11,pcVar15);
        FunctionProxy::VerifyOriginalEntryPoint((FunctionProxy *)pFVar11);
      }
    }
    ThreadContext::QueueFreeOldEntryPointInfoIfInScript(this_00,this);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
  }
  return;
}

Assistant:

void FunctionEntryPointInfo::Expire()
    {
        if (this->lastCallsCount != this->callsCount || !this->IsNativeEntryPointProcessed() || this->IsCleanedUp())
        {
            return;
        }

        ThreadContext* threadContext = this->functionProxy->GetScriptContext()->GetThreadContext();

        Assert(!this->functionProxy->IsDeferred());
        FunctionBody* functionBody = this->functionProxy->GetFunctionBody();

        FunctionEntryPointInfo *simpleJitEntryPointInfo = functionBody->GetSimpleJitEntryPointInfo();
        const bool expiringSimpleJitEntryPointInfo = simpleJitEntryPointInfo == this;
        if(expiringSimpleJitEntryPointInfo)
        {
            if(functionBody->GetExecutionMode() != ExecutionMode::FullJit)
            {
                // Don't expire simple JIT code until the transition to full JIT
                return;
            }
            simpleJitEntryPointInfo = nullptr;
            functionBody->SetSimpleJitEntryPointInfo(nullptr);
        }

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);

            FunctionEntryPointInfo* newEntryPoint = nullptr;
            FunctionEntryPointInfo *const defaultEntryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
            if(this == defaultEntryPointInfo)
            {
                if(simpleJitEntryPointInfo)
                {
                    newEntryPoint = simpleJitEntryPointInfo;
                    functionBody->SetDefaultFunctionEntryPointInfo(simpleJitEntryPointInfo, newEntryPoint->GetNativeEntrypoint());
                    functionBody->ResetSimpleJitLimitAndCallCount();
                }
#ifdef ASMJS_PLAT
                else if (functionBody->GetIsAsmJsFunction())
                {
                    // the new entrypoint will be set to interpreter
                    newEntryPoint = functionBody->CreateNewDefaultEntryPoint();
                    newEntryPoint->SetIsAsmJSFunction(true);
                    newEntryPoint->jsMethod = AsmJsDefaultEntryThunk;
                    functionBody->SetIsAsmJsFullJitScheduled(false);
                    functionBody->SetDefaultInterpreterExecutionMode();
                    this->functionProxy->SetOriginalEntryPoint(AsmJsDefaultEntryThunk);
                }
#endif
                else
                {
                    newEntryPoint = functionBody->CreateNewDefaultEntryPoint();
                    functionBody->ReinitializeExecutionModeAndLimits();
#if ENABLE_NATIVE_CODEGEN
                    // In order for the function to ever get JIT again, we need to call GenerateFunction now
                    if (!PHASE_OFF(Js::BackEndPhase, functionBody) && !functionBody->GetScriptContext()->GetConfig()->IsNoNative())
                    {
                        GenerateFunction(functionBody->GetScriptContext()->GetNativeCodeGenerator(), functionBody);
                    }
#endif
                }
                functionBody->TraceExecutionMode("JitCodeExpired");
            }
            else
            {
                newEntryPoint = defaultEntryPointInfo;
            }

            OUTPUT_TRACE(Js::ExpirableCollectPhase,  _u("Expiring 0x%p\n"), this);
            this->functionProxy->MapFunctionObjectTypes([&] (ScriptFunctionType* functionType)
            {
                Assert(functionType->GetTypeId() == TypeIds_Function);

                if (functionType->GetEntryPointInfo() == this)
                {
                    OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Type 0x%p uses this entry point- switching to default entry point\n"), this);
                    functionType->SetEntryPointInfo(newEntryPoint);
                    // we are allowed to replace the entry point on the type only if it's
                    // directly using the jitted code or a type is referencing this entry point
                    // but the entry point hasn't been called since the codegen thunk was installed on it
                    if (functionType->GetEntryPoint() == functionProxy->GetDirectEntryPoint(this) || IsIntermediateCodeGenThunk(functionType->GetEntryPoint()))
                    {
                        functionType->SetEntryPoint(this->functionProxy->GetDirectEntryPoint(newEntryPoint));
                    }
                }
                else
                {
                    Assert(!functionType->GetEntryPointInfo()->IsFunctionEntryPointInfo() ||
                        ((FunctionEntryPointInfo*)functionType->GetEntryPointInfo())->IsCleanedUp()
                        || functionType->GetEntryPoint() != this->GetNativeEntrypoint());
                }
            });

            if(expiringSimpleJitEntryPointInfo)
            {
                // We could have just created a new entry point info that is using the simple JIT code. An allocation may have
                // triggered shortly after, resulting in expiring the simple JIT entry point info. Update any entry point infos
                // that are using the simple JIT code, and update the original entry point as necessary as well.
                const JavascriptMethod newOriginalEntryPoint =
                    functionBody->GetDynamicInterpreterEntryPoint()
                        ?   reinterpret_cast<JavascriptMethod>(
                                InterpreterThunkEmitter::ConvertToEntryPoint(functionBody->GetDynamicInterpreterEntryPoint()))
                        :   DefaultEntryThunk;
                const JavascriptMethod currentThunk = functionBody->GetScriptContext()->CurrentThunk;
                const JavascriptMethod newDirectEntryPoint =
                    currentThunk == DefaultEntryThunk ? newOriginalEntryPoint : currentThunk;
                const JavascriptMethod simpleJitNativeAddress = GetNativeEntrypoint();
                functionBody->MapEntryPoints([&](const int entryPointIndex, FunctionEntryPointInfo *const entryPointInfo)
                {
                    if(entryPointInfo != this && entryPointInfo->jsMethod == simpleJitNativeAddress)
                    {
                        entryPointInfo->jsMethod = newDirectEntryPoint;
                    }
                });
                if(functionBody->GetOriginalEntryPoint_Unchecked() == simpleJitNativeAddress)
                {
                    functionBody->SetOriginalEntryPoint(newOriginalEntryPoint);
                    functionBody->VerifyOriginalEntryPoint();
                }
            }

            threadContext->QueueFreeOldEntryPointInfoIfInScript(this);
        }